

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O1

rtosc_arg_t extract_arg(uint8_t *arg_pos,char type)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  byte bVar5;
  uint8_t *puVar6;
  byte bVar7;
  undefined7 in_register_00000031;
  ulong uVar8;
  rtosc_arg_t rVar9;
  
  uVar3 = (int)CONCAT71(in_register_00000031,type) - 0x53;
  if ((0x21 < uVar3) || ((0x3846b8001U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
    uVar8 = (ulong)(type == 'T');
    bVar5 = 0;
    bVar7 = 0;
    uVar4 = 0;
    puVar6 = (uint8_t *)0x0;
    uVar3 = 0;
    goto switchD_001027b8_caseD_65;
  }
  puVar6 = (uint8_t *)0x0;
  uVar4 = 0;
  bVar5 = 0;
  bVar7 = 0;
  uVar8 = 0;
  uVar3 = 0;
  switch((int)type) {
  case 0x62:
    uVar3 = (uint)*arg_pos;
    bVar5 = arg_pos[1];
    bVar7 = arg_pos[2];
    uVar8 = (ulong)arg_pos[3];
    puVar6 = arg_pos + 4;
    uVar4 = 0;
    goto switchD_001027b8_caseD_65;
  case 99:
  case 0x66:
  case 0x69:
  case 0x72:
    bVar1 = *arg_pos;
    bVar5 = arg_pos[1];
    bVar7 = arg_pos[2];
    bVar2 = arg_pos[3];
    break;
  case 100:
  case 0x68:
  case 0x74:
    uVar3 = *(uint *)arg_pos;
    uVar4 = (ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18)
    ;
    bVar1 = arg_pos[4];
    bVar5 = arg_pos[5];
    bVar7 = arg_pos[6];
    bVar2 = arg_pos[7];
    goto LAB_001027e0;
  case 0x65:
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6e:
  case 0x6f:
  case 0x70:
  case 0x71:
    goto switchD_001027b8_caseD_65;
  case 0x6d:
    bVar2 = *arg_pos;
    bVar7 = arg_pos[1];
    bVar5 = arg_pos[2];
    bVar1 = arg_pos[3];
    break;
  case 0x73:
    goto switchD_001027b8_caseD_73;
  default:
    bVar7 = 0;
    uVar8 = 0;
    uVar3 = 0;
    if (type != 0x53) goto switchD_001027b8_caseD_65;
    goto switchD_001027b8_caseD_73;
  }
  uVar4 = 0;
LAB_001027e0:
  uVar3 = (uint)bVar1;
  uVar8 = (ulong)bVar2;
  puVar6 = (uint8_t *)0x0;
switchD_001027b8_caseD_65:
  rVar9._0_8_ = uVar4 << 0x20 |
                uVar8 & 0xff | (ulong)((uint)bVar7 << 8 | (uint)bVar5 << 0x10 | uVar3 << 0x18);
  rVar9.b.data = puVar6;
  return rVar9;
switchD_001027b8_caseD_73:
  bVar7 = (byte)((ulong)arg_pos >> 8);
  bVar5 = (byte)((ulong)arg_pos >> 0x10);
  uVar3 = (uint)((ulong)arg_pos >> 0x18) & 0xff;
  uVar4 = (ulong)arg_pos >> 0x20;
  puVar6 = (uint8_t *)0x0;
  uVar8 = (ulong)arg_pos & 0xffffffff;
  goto switchD_001027b8_caseD_65;
}

Assistant:

static rtosc_arg_t extract_arg(const uint8_t *arg_pos, char type)
{
    rtosc_arg_t result = {0};
    //trivial case
    if(!has_reserved(type)) {
        switch(type)
        {
            case 'T':
                result.T = true;
                break;
            case 'F':
                result.T = false;
                break;
            default:
                ;
        }
    } else {
        switch(type)
        {
            case 'h':
            case 't':
            case 'd':
                result.t |= (((uint64_t)*arg_pos++) << 56);
                result.t |= (((uint64_t)*arg_pos++) << 48);
                result.t |= (((uint64_t)*arg_pos++) << 40);
                result.t |= (((uint64_t)*arg_pos++) << 32);
                result.t |= (((uint64_t)*arg_pos++) << 24);
                result.t |= (((uint64_t)*arg_pos++) << 16);
                result.t |= (((uint64_t)*arg_pos++) << 8);
                result.t |= (((uint64_t)*arg_pos++));
                break;
            case 'r':
            case 'f':
            case 'c':
            case 'i':
                result.i |= (*arg_pos++ << 24);
                result.i |= (*arg_pos++ << 16);
                result.i |= (*arg_pos++ << 8);
                result.i |= (*arg_pos++);
                break;
            case 'm':
                result.m[0] = *arg_pos++;
                result.m[1] = *arg_pos++;
                result.m[2] = *arg_pos++;
                result.m[3] = *arg_pos++;
                break;
            case 'b':
                result.b.len |= (*arg_pos++ << 24);
                result.b.len |= (*arg_pos++ << 16);
                result.b.len |= (*arg_pos++ << 8);
                result.b.len |= (*arg_pos++);
                result.b.data = (unsigned char *)arg_pos;
                break;
            case 'S':
            case 's':
                result.s = (char *)arg_pos;
                break;
        }
    }

    return result;
}